

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuLaunchFunctsC.H
# Opt level: O0

void amrex::
     ParallelFor<int,EBPLM::PredictStateOnZFace(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__1,void>
               (Box *box,int ncomp,anon_class_696_20_3436472d *f)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_ESI;
  int *in_RDI;
  int i;
  int j;
  int k;
  int n;
  Dim3 hi;
  Dim3 lo;
  int j_00;
  int i_00;
  int iVar7;
  int iVar8;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[2];
  iVar4 = in_RDI[3];
  iVar5 = in_RDI[4];
  iVar6 = in_RDI[5];
  for (iVar8 = 0; iVar7 = iVar3, iVar8 < in_ESI; iVar8 = iVar8 + 1) {
    for (; i_00 = iVar2, iVar7 <= iVar6; iVar7 = iVar7 + 1) {
      for (; j_00 = iVar1, i_00 <= iVar5; i_00 = i_00 + 1) {
        for (; j_00 <= iVar4; j_00 = j_00 + 1) {
          detail::
          call_f<EBPLM::PredictStateOnZFace(amrex::Box_const&,int,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,amrex::BCRec_const*,bool)::__1,int>
                    ((anon_class_696_20_3436472d *)CONCAT44(iVar8,iVar7),i_00,j_00,0,0xc502a5);
        }
      }
    }
  }
  return;
}

Assistant:

void ParallelFor (Box const& box, T ncomp, L&& f) noexcept
{
    const auto lo = amrex::lbound(box);
    const auto hi = amrex::ubound(box);
    for (T n = 0; n < ncomp; ++n) {
        for (int k = lo.z; k <= hi.z; ++k) {
        for (int j = lo.y; j <= hi.y; ++j) {
        AMREX_PRAGMA_SIMD
        for (int i = lo.x; i <= hi.x; ++i) {
            detail::call_f(f,i,j,k,n);
        }}}
    }
}